

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::CodeHolder::relocateToBase(CodeHolder *this,uint64_t baseAddress)

{
  Arch AVar1;
  Section *pSVar2;
  long lVar3;
  ulong uVar4;
  uint64_t uVar5;
  uint8_t *puVar6;
  Arch AVar7;
  bool bVar8;
  Error EVar9;
  Section **ppSVar10;
  Section *pSVar11;
  CodeHolder *offset64;
  AddressTableEntry *pAVar12;
  long lVar13;
  uint8_t uVar14;
  uint uVar15;
  ZoneVector<asmjit::v1_14::Section_*> *this_00;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  Compare<(asmjit::v1_14::Support::SortOrder)0> local_99;
  ulong local_98;
  Section *local_90;
  uint64_t local_88;
  uint64_t local_80;
  uint8_t *local_78;
  CodeHolder *local_70;
  Value local_68;
  Value local_60;
  ZoneTree<asmjit::v1_14::AddressTableEntry> *local_58;
  ZoneVector<asmjit::v1_14::Section_*> *local_50;
  long local_48;
  long local_40;
  CodeHolder *local_38;
  
  if (baseAddress == 0xffffffffffffffff) {
    EVar9 = 2;
  }
  else {
    this->_baseAddress = baseAddress;
    AVar1 = (this->_environment)._arch;
    pSVar2 = this->_addressTableSection;
    if (pSVar2 == (Section *)0x0) {
      local_78 = (uint8_t *)0x0;
    }
    else {
      EVar9 = reserveBuffer(this,&pSVar2->_buffer,pSVar2->_virtualSize);
      if (EVar9 != 0) {
        return EVar9;
      }
      local_78 = (pSVar2->_buffer)._data;
    }
    local_98 = 0;
    AVar7 = AVar1 & k32BitMask;
    local_48 = *(long *)&this->_relocations;
    this_00 = &this->_sections;
    local_58 = &this->_addressTableEntries;
    local_60.constant = (ulong)AVar7 ^ 3;
    local_40 = (ulong)*(uint *)&this->field_0x110 << 3;
    local_90 = pSVar2;
    local_88 = baseAddress;
    local_68 = (Value)this;
    local_50 = this_00;
    for (lVar17 = 0; local_40 != lVar17; lVar17 = lVar17 + 8) {
      lVar3 = *(long *)(local_48 + lVar17);
      if (*(int *)(lVar3 + 4) != 0) {
        ppSVar10 = ZoneVector<asmjit::v1_14::Section_*>::operator[]
                             (this_00,(ulong)*(uint *)(lVar3 + 0x10));
        pSVar2 = *ppSVar10;
        if ((ulong)*(uint *)(lVar3 + 0x14) == 0xffffffff) {
          pSVar11 = (Section *)0x0;
        }
        else {
          ppSVar10 = ZoneVector<asmjit::v1_14::Section_*>::operator[]
                               (this_00,(ulong)*(uint *)(lVar3 + 0x14));
          pSVar11 = *ppSVar10;
        }
        local_70 = *(CodeHolder **)(lVar3 + 0x20);
        uVar18 = (pSVar2->_buffer)._size;
        uVar4 = *(ulong *)(lVar3 + 0x18);
        if (((uVar18 <= uVar4) || (uVar16 = (ulong)*(byte *)(lVar3 + 10), uVar18 - uVar4 < uVar16))
           || (4 < *(int *)(lVar3 + 4) - 1U)) {
          return 0x17;
        }
        uVar5 = pSVar2->_offset;
        puVar6 = (pSVar2->_buffer)._data;
        offset64 = local_70;
        switch(*(int *)(lVar3 + 4)) {
        case 1:
          EVar9 = CodeHolder_evaluateExpression
                            (local_70,(Expression *)&local_70,
                             (uint64_t *)&switchD_001121d2::switchdataD_00148500);
          offset64 = local_70;
          if (EVar9 != 0) {
            return EVar9;
          }
          break;
        case 3:
          if (pSVar11 == (Section *)0x0) {
            return 0x17;
          }
          offset64 = (CodeHolder *)(&(local_70->_environment)._arch + pSVar11->_offset + local_88);
          break;
        case 4:
          offset64 = (CodeHolder *)((long)local_70 - (uVar4 + uVar16 + uVar5 + local_88));
          if ((AVar1 & k32BitMask) == kUnknown) {
            if ((CodeHolder *)(long)(int)offset64 != offset64) {
              return 0x18;
            }
          }
          else {
            offset64 = (CodeHolder *)(long)(int)offset64;
          }
          break;
        case 5:
          if (*(char *)(lVar3 + 0xb) != '\x04') {
            return 0x17;
          }
          uVar18 = *(byte *)(lVar3 + 0xc) + uVar4;
          if (uVar18 < 2) {
            return 0x17;
          }
          offset64 = (CodeHolder *)((long)local_70 - (uVar4 + uVar16 + local_88 + uVar5));
          if ((CodeHolder *)(long)(int)offset64 != offset64) {
            local_80 = uVar5;
            local_38 = local_70;
            pAVar12 = ZoneTree<asmjit::v1_14::AddressTableEntry>::
                      get<unsigned_long,asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>
                                (local_58,(unsigned_long *)&local_38,&local_99);
            if (pAVar12 == (AddressTableEntry *)0x0) {
              return 0x17;
            }
            if (local_90 == (Section *)0x0) {
              DebugUtils::assertionFailed
                        ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/codeholder.cpp"
                         ,0x3ef,"addressTableSection != nullptr");
            }
            uVar15 = *(uint *)(pAVar12 + 0x18);
            if (uVar15 == 0xffffffff) {
              uVar15 = (uint)local_98;
              *(uint *)(pAVar12 + 0x18) = uVar15;
              local_98 = (ulong)(uVar15 + 1);
            }
            lVar13 = (ulong)uVar15 << ((byte)local_60.constant & 0x3f);
            offset64 = (CodeHolder *)((local_90->_offset - (uVar4 + local_80 + uVar16)) + lVar13);
            if ((CodeHolder *)(long)(int)offset64 != offset64) {
              return 0x18;
            }
            uVar14 = '\x15';
            if (puVar6[uVar18 - 1] != 0xe8) {
              if (puVar6[uVar18 - 1] != 0xe9) {
                return 0x17;
              }
              uVar14 = '%';
            }
            puVar6[uVar18 - 2] = 0xff;
            puVar6[uVar18 - 1] = uVar14;
            *(undefined8 *)(local_78 + lVar13) = *(undefined8 *)(lVar3 + 0x20);
          }
        }
        bVar8 = CodeWriterUtils::writeOffset
                          (puVar6 + *(long *)(lVar3 + 0x18),(int64_t)offset64,
                           (OffsetFormat *)(lVar3 + 8));
        this_00 = local_50;
        if (!bVar8) {
          return 0x17;
        }
      }
    }
    ppSVar10 = ZoneVector<asmjit::v1_14::Section_*>::last
                         ((ZoneVector<asmjit::v1_14::Section_*> *)(local_68.constant + 0xe8));
    EVar9 = 0;
    if (*ppSVar10 == local_90) {
      if (local_90 == (Section *)0x0) {
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/codeholder.cpp"
                   ,0x420,"addressTableSection != nullptr");
      }
      uVar18 = (ulong)(uint)((int)local_98 << (AVar7 ^ kRISCV32));
      (local_90->_buffer)._size = uVar18;
      local_90->_virtualSize = uVar18;
    }
  }
  return EVar9;
}

Assistant:

Error CodeHolder::relocateToBase(uint64_t baseAddress) noexcept {
  // Base address must be provided.
  if (ASMJIT_UNLIKELY(baseAddress == Globals::kNoBaseAddress))
    return DebugUtils::errored(kErrorInvalidArgument);

  _baseAddress = baseAddress;
  uint32_t addressSize = _environment.registerSize();

  Section* addressTableSection = _addressTableSection;
  uint32_t addressTableEntryCount = 0;
  uint8_t* addressTableEntryData = nullptr;

  if (addressTableSection) {
    ASMJIT_PROPAGATE(
      reserveBuffer(&addressTableSection->_buffer, size_t(addressTableSection->virtualSize())));
    addressTableEntryData = addressTableSection->_buffer.data();
  }

  // Relocate all recorded locations.
  for (const RelocEntry* re : _relocations) {
    // Possibly deleted or optimized-out entry.
    if (re->relocType() == RelocType::kNone)
      continue;

    Section* sourceSection = sectionById(re->sourceSectionId());
    Section* targetSection = nullptr;

    if (re->targetSectionId() != Globals::kInvalidId)
      targetSection = sectionById(re->targetSectionId());

    uint64_t value = re->payload();
    uint64_t sectionOffset = sourceSection->offset();
    uint64_t sourceOffset = re->sourceOffset();

    // Make sure that the `RelocEntry` doesn't go out of bounds.
    size_t regionSize = re->format().regionSize();
    if (ASMJIT_UNLIKELY(re->sourceOffset() >= sourceSection->bufferSize() ||
                        sourceSection->bufferSize() - size_t(re->sourceOffset()) < regionSize))
      return DebugUtils::errored(kErrorInvalidRelocEntry);

    uint8_t* buffer = sourceSection->data();

    switch (re->relocType()) {
      case RelocType::kExpression: {
        Expression* expression = (Expression*)(uintptr_t(value));
        ASMJIT_PROPAGATE(CodeHolder_evaluateExpression(this, expression, &value));
        break;
      }

      case RelocType::kAbsToAbs: {
        break;
      }

      case RelocType::kRelToAbs: {
        // Value is currently a relative offset from the start of its section.
        // We have to convert it to an absolute offset (including base address).
        if (ASMJIT_UNLIKELY(!targetSection))
          return DebugUtils::errored(kErrorInvalidRelocEntry);

        //value += baseAddress + sectionOffset + sourceOffset + regionSize;
        value += baseAddress + targetSection->offset();
        break;
      }

      case RelocType::kAbsToRel: {
        value -= baseAddress + sectionOffset + sourceOffset + regionSize;

        // Sign extend as we are not interested in the high 32-bit word in a 32-bit address space.
        if (addressSize <= 4)
          value = uint64_t(int64_t(int32_t(value & 0xFFFFFFFFu)));
        else if (!Support::isInt32(int64_t(value)))
          return DebugUtils::errored(kErrorRelocOffsetOutOfRange);

        break;
      }

      case RelocType::kX64AddressEntry: {
        size_t valueOffset = size_t(re->sourceOffset()) + re->format().valueOffset();
        if (re->format().valueSize() != 4 || valueOffset < 2)
          return DebugUtils::errored(kErrorInvalidRelocEntry);

        // First try whether a relative 32-bit displacement would work.
        value -= baseAddress + sectionOffset + sourceOffset + regionSize;
        if (!Support::isInt32(int64_t(value))) {
          // Relative 32-bit displacement is not possible, use '.addrtab' section.
          AddressTableEntry* atEntry = _addressTableEntries.get(re->payload());
          if (ASMJIT_UNLIKELY(!atEntry))
            return DebugUtils::errored(kErrorInvalidRelocEntry);

          // Cannot be null as we have just matched the `AddressTableEntry`.
          ASMJIT_ASSERT(addressTableSection != nullptr);

          if (!atEntry->hasAssignedSlot())
            atEntry->_slot = addressTableEntryCount++;

          size_t atEntryIndex = size_t(atEntry->slot()) * addressSize;
          uint64_t addrSrc = sectionOffset + sourceOffset + regionSize;
          uint64_t addrDst = addressTableSection->offset() + uint64_t(atEntryIndex);

          value = addrDst - addrSrc;
          if (!Support::isInt32(int64_t(value)))
            return DebugUtils::errored(kErrorRelocOffsetOutOfRange);

          // Bytes that replace [REX, OPCODE] bytes.
          uint32_t byte0 = 0xFF;
          uint32_t byte1 = buffer[valueOffset - 1];

          if (byte1 == 0xE8) {
            // Patch CALL/MOD byte to FF /2 (-> 0x15).
            byte1 = x86EncodeMod(0, 2, 5);
          }
          else if (byte1 == 0xE9) {
            // Patch JMP/MOD byte to FF /4 (-> 0x25).
            byte1 = x86EncodeMod(0, 4, 5);
          }
          else {
            return DebugUtils::errored(kErrorInvalidRelocEntry);
          }

          // Patch `jmp/call` instruction.
          buffer[valueOffset - 2] = uint8_t(byte0);
          buffer[valueOffset - 1] = uint8_t(byte1);

          Support::writeU64uLE(addressTableEntryData + atEntryIndex, re->payload());
        }
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidRelocEntry);
    }

    if (!CodeWriterUtils::writeOffset(buffer + re->sourceOffset(), int64_t(value), re->format())) {
      return DebugUtils::errored(kErrorInvalidRelocEntry);
    }
  }

  // Fixup the virtual size of the address table if it's the last section.
  if (_sectionsByOrder.last() == addressTableSection) {
    ASMJIT_ASSERT(addressTableSection != nullptr);

    size_t addressTableSize = addressTableEntryCount * addressSize;
    addressTableSection->_buffer._size = addressTableSize;
    addressTableSection->_virtualSize = addressTableSize;
  }

  return kErrorOk;
}